

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.hh
# Opt level: O0

void __thiscall
avro::detail::BufferImpl::copyData
          (BufferImpl *this,BufferImpl *dest,const_iterator *iter,size_type offset,size_type bytes)

{
  reference pvVar1;
  size_type sVar2;
  size_type in_RCX;
  _Deque_iterator<avro::detail::Chunk,_const_avro::detail::Chunk_&,_const_avro::detail::Chunk_*>
  *in_RDX;
  value_type *in_RSI;
  deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_> *in_R8;
  size_type excess;
  size_type copied;
  value_type *__x;
  deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_> *this_00;
  size_type local_20;
  
  this_00 = (deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_> *)0x0;
  local_20 = in_RCX;
  while (this_00 < in_R8) {
    __x = in_RSI;
    std::
    _Deque_iterator<avro::detail::Chunk,_const_avro::detail::Chunk_&,_const_avro::detail::Chunk_*>::
    operator*(in_RDX);
    std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::push_back
              ((deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_> *)in_RDX,__x);
    pvVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::back(this_00);
    Chunk::truncateFront(pvVar1,local_20);
    local_20 = 0;
    pvVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::back(this_00);
    sVar2 = Chunk::dataSize(pvVar1);
    this_00 = (deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_> *)
              ((long)&(this_00->
                      super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>).
                      _M_impl.super__Deque_impl_data._M_map + sVar2);
    std::
    _Deque_iterator<avro::detail::Chunk,_const_avro::detail::Chunk_&,_const_avro::detail::Chunk_*>::
    operator++(in_RDX);
  }
  pvVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::back(this_00);
  Chunk::truncateBack(pvVar1,(long)this_00 - (long)in_R8);
  in_RSI[3].callOnDestroy_.px =
       (element_type *)
       ((long)&(in_R8->super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>)
               ._M_impl.super__Deque_impl_data._M_map +
       (long)&((in_RSI[3].callOnDestroy_.px)->func_).super_function0<void>);
  return;
}

Assistant:

void copyData(BufferImpl &dest, 
                  ChunkList::const_iterator iter,
                  size_type offset, 
                  size_type bytes) const
    {
        // now we are positioned to start the copying, copy as many
        // chunks as we need, the first chunk may have a non-zero offset 
        // if the data to copy is not at the start of the chunk 
        size_type copied = 0;
        while(copied < bytes) {

            dest.readChunks_.push_back(*iter);

            // offset only applies in the first chunk, 
            // all subsequent chunks are copied from the start
            dest.readChunks_.back().truncateFront(offset);
            offset = 0;

            copied += dest.readChunks_.back().dataSize(); 
            ++iter;
        }

        // if the last chunk copied has more bytes than we need, truncate it
        size_type excess = copied - bytes;
        dest.readChunks_.back().truncateBack(excess);

        dest.size_ += bytes;
    }